

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.cpp
# Opt level: O0

void __thiscall HashTable<int>::HashTable(HashTable<int> *this,int *arr,int n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  Node *pNVar4;
  int local_24;
  int local_20;
  int i_1;
  int i;
  int n_local;
  int *arr_local;
  HashTable<int> *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  piVar3 = (int *)operator_new__(uVar2);
  this->copyArr = piVar3;
  pNVar4 = (Node *)operator_new__(0x140);
  this->HashArray = pNVar4;
  this->numOfArray = n;
  for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
    this->copyArr[local_20] = arr[local_20];
  }
  for (local_24 = 0; local_24 < 0x14; local_24 = local_24 + 1) {
    this->HashArray[local_24].key = 9999999;
    this->HashArray[local_24].value = 9999999;
    this->HashArray[local_24].next = (node *)0x0;
  }
  CreatHashTable(this);
  return;
}

Assistant:

HashTable(DataType arr[], int n) {
		copyArr = new DataType[n];
		HashArray = new Node[20];
		numOfArray = n;

		for (int i = 0; i < n; i++) {
			copyArr[i] = arr[i];			//拷贝一遍原数据
		}

		for (int i = 0; i < 20; i++) {		//初始化哈希主数组
				HashArray[i].key = MyNull;
				HashArray[i].value = MyNull;
				HashArray[i].next = NULL;
		}

		CreatHashTable();					//构建哈希表
	}